

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msgio.c
# Opt level: O3

int fd_send(int sock,int *fds,size_t nfds)

{
  ulong uVar1;
  int iVar2;
  int *piVar3;
  cmsghdr *__cmsg;
  ssize_t sVar4;
  ulong uVar5;
  ulong uVar6;
  iovec iov;
  msghdr msg;
  undefined1 local_12d;
  int local_12c;
  ulong local_128;
  int *local_120;
  size_t local_118;
  ulong local_110;
  ulong local_108;
  iovec local_100;
  msghdr local_f0;
  fd_set local_b8;
  
  if (fds == (int *)0x0 || nfds == 0) {
    piVar3 = __errno_location();
    *piVar3 = 0x16;
LAB_00106b53:
    iVar2 = -1;
  }
  else {
    local_108 = 1L << ((byte)sock & 0x3f);
    local_110 = (ulong)((uint)sock >> 6);
    local_12c = sock + 1;
    local_128 = 0;
    local_120 = fds;
    local_118 = nfds;
    do {
      piVar3 = local_120;
      uVar5 = local_118 - local_128;
      if (0x5e7 < uVar5) {
        uVar5 = 0x5e8;
      }
      if (sock < 0) {
        __assert_fail("sock >= 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Zer0-One[P]libnv-portable/src/msgio.c"
                      ,0xec,"int fd_package_send(int, const int *, size_t)");
      }
      bzero(&local_f0,0x38);
      local_12d = 0;
      local_100.iov_base = &local_12d;
      local_100.iov_len = 1;
      local_f0.msg_iov = &local_100;
      local_f0.msg_iovlen = 1;
      local_f0.msg_controllen = uVar5 * 0x18;
      __cmsg = (cmsghdr *)calloc(1,local_f0.msg_controllen);
      uVar1 = local_128;
      if (__cmsg == (cmsghdr *)0x0) goto LAB_00106b53;
      uVar6 = 1;
      local_f0.msg_control = __cmsg;
      do {
        iVar2 = piVar3[uVar1 + (uVar6 - 1)];
        if (iVar2 < 0) {
          __assert_fail("fd >= 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Zer0-One[P]libnv-portable/src/msgio.c"
                        ,0x50,"int msghdr_add_fd(struct cmsghdr *, int)");
        }
        __cmsg->cmsg_level = 1;
        __cmsg->cmsg_type = 1;
        __cmsg->cmsg_len = 0x14;
        *(int *)&__cmsg[1].cmsg_len = iVar2;
        __cmsg = __cmsg_nxthdr(&local_f0,__cmsg);
      } while ((uVar6 < uVar5) && (uVar6 = uVar6 + 1, __cmsg != (cmsghdr *)0x0));
      while( true ) {
        local_b8.fds_bits[0xe] = 0;
        local_b8.fds_bits[0xf] = 0;
        local_b8.fds_bits[0xc] = 0;
        local_b8.fds_bits[0xd] = 0;
        local_b8.fds_bits[10] = 0;
        local_b8.fds_bits[0xb] = 0;
        local_b8.fds_bits[8] = 0;
        local_b8.fds_bits[9] = 0;
        local_b8.fds_bits[6] = 0;
        local_b8.fds_bits[7] = 0;
        local_b8.fds_bits[4] = 0;
        local_b8.fds_bits[5] = 0;
        local_b8.fds_bits[2] = 0;
        local_b8.fds_bits[3] = 0;
        local_b8.fds_bits[0] = 0;
        local_b8.fds_bits[1] = 0;
        local_b8.fds_bits[local_110] = local_b8.fds_bits[local_110] | local_108;
        select(local_12c,(fd_set *)0x0,&local_b8,(fd_set *)0x0,(timeval *)0x0);
        sVar4 = sendmsg(sock,&local_f0,0);
        piVar3 = __errno_location();
        iVar2 = *piVar3;
        if (sVar4 != -1) break;
        if (iVar2 != 4) {
          free(local_f0.msg_control);
          *piVar3 = iVar2;
          goto LAB_00106b53;
        }
      }
      free(local_f0.msg_control);
      *piVar3 = iVar2;
      local_128 = (ulong)(uint)((int)local_128 + (int)uVar5);
      iVar2 = 0;
    } while (local_128 < local_118);
  }
  return iVar2;
}

Assistant:

int
fd_send(int sock, const int *fds, size_t nfds)
{
	unsigned int i, step;
	int ret;

	if (nfds == 0 || fds == NULL) {
		errno = EINVAL;
		return (-1);
	}

	ret = i = step = 0;
	while (i < nfds) {
		if (PKG_MAX_SIZE < nfds - i)
			step = PKG_MAX_SIZE;
		else
			step = nfds - i;
		ret = fd_package_send(sock, fds + i, step);
		if (ret != 0)
			break;
		i += step;
	}

	return (ret);
}